

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O2

void __thiscall TSMuxer::writeSIT(TSMuxer *this)

{
  pointer puVar1;
  uint uVar2;
  int iVar3;
  
  iVar3 = this->m_outBufLen;
  if (this->m_m2tsMode == true) {
    iVar3 = iVar3 + 4;
    this->m_outBufLen = iVar3;
    this->m_processedBlockSize = this->m_processedBlockSize + 4;
    this->m_pcrBits = this->m_pcrBits + 0x20;
  }
  memcpy(this->m_outBuf + iVar3,DefaultSitTableOne,0xbc);
  uVar2 = this->m_sitCnt;
  this->m_sitCnt = uVar2 + 1;
  *(uint *)(this->m_outBuf + this->m_outBufLen) =
       *(uint *)(this->m_outBuf + this->m_outBufLen) & 0xf0ffffff | (uVar2 & 0xf) << 0x18;
  this->m_outBufLen = this->m_outBufLen + 0xbc;
  this->m_processedBlockSize = this->m_processedBlockSize + 0xbc;
  this->m_pcrBits = this->m_pcrBits + 0x5e0;
  puVar1 = (this->m_muxedPacketCnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish + -1;
  *puVar1 = *puVar1 + 1;
  writeOutBuffer(this);
  return;
}

Assistant:

void TSMuxer::writeSIT()
{
    if (m_m2tsMode)
    {
        m_outBufLen += 4;
        m_processedBlockSize += 4;
        m_pcrBits += 4 * 8;
    }
    memcpy(m_outBuf + m_outBufLen, DefaultSitTableOne, TS_FRAME_SIZE);
    const auto tsPacket = reinterpret_cast<TSPacket*>(m_outBuf + m_outBufLen);
    tsPacket->counter = m_sitCnt++;
    m_outBufLen += TS_FRAME_SIZE;
    m_processedBlockSize += TS_FRAME_SIZE;
    m_pcrBits += TS_FRAME_SIZE * 8;
    m_muxedPacketCnt[m_muxedPacketCnt.size() - 1]++;
    writeOutBuffer();
}